

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwFlush(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *__stream;
  
  pFVar2 = mwLogR();
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = mwFlushR();
    if (iVar1 != 0) {
      __stream = (FILE *)mwLogR();
      fflush(__stream);
      return;
    }
  }
  return;
}

Assistant:

static void mwFlush()
{
	if (mwLogR() == NULL) {
		return;
	}
#ifdef MW_FLUSH
	fflush(mwLogR());
#else
	if (mwFlushR()) {
		fflush(mwLogR());
	}
#endif
	return;
}